

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O2

void __thiscall QSqlQueryModelPrivate::initColOffsets(QSqlQueryModelPrivate *this,int size)

{
  QVarLengthArray<int,_56LL>::resize(&this->colOffsets,(long)size);
  memset((this->colOffsets).super_QVLABase<int>.super_QVLABaseBase.ptr,0,
         (this->colOffsets).super_QVLABase<int>.super_QVLABaseBase.s << 2);
  return;
}

Assistant:

void QSqlQueryModelPrivate::initColOffsets(int size)
{
    colOffsets.resize(size);
    memset(colOffsets.data(), 0, colOffsets.size() * sizeof(int));
}